

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

int expression_tree::sequential::
    evaluate<int,expression_tree::cache_on_assignment,expression_tree::sequential>
              (operation<int> *o,
              node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential> *l,
              node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential> *r)

{
  int iVar1;
  int local_28;
  int local_24;
  node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential> *local_20;
  node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential> *r_local;
  node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential> *l_local;
  operation<int> *o_local;
  
  local_20 = r;
  r_local = l;
  l_local = (node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential> *)o;
  local_24 = node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential>::evaluate
                       (l);
  local_28 = node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential>::evaluate
                       (local_20);
  iVar1 = std::function<int_(const_int_&,_const_int_&)>::operator()(o,&local_24,&local_28);
  return iVar1;
}

Assistant:

static T evaluate(const detail::operation<T>& o, const node<T, C, E>& l, const node<T, C, E>& r)
	{
		return o(l.evaluate(), r.evaluate());
	}